

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O1

void message_adddollar(t_message *x,t_floatarg f)

{
  t_atom a;
  t_atom local_18;
  
  local_18.a_w.w_float = 0.0;
  if (0 < (int)f) {
    local_18.a_w.w_index = (int)f;
  }
  local_18.a_type = A_DOLLAR;
  binbuf_add((x->m_text).te_binbuf,1,&local_18);
  glist_retext(x->m_glist,&x->m_text);
  return;
}

Assistant:

static void message_adddollar(t_message *x, t_floatarg f)
{
    t_atom a;
    int n = f;
    if (n < 0)
        n = 0;
    SETDOLLAR(&a, n);
    binbuf_add(x->m_text.te_binbuf, 1, &a);
    glist_retext(x->m_glist, &x->m_text);
}